

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Name> *
wasm::WATParser::tableidx<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  char *pcVar3;
  _Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *p_Var4;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [8];
  MaybeResult<wasm::Name> _val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 auStack_48 [8];
  MaybeResult<wasm::Name> idx;
  
  maybeTableidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)auStack_48,ctx);
  if (idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)auStack_48);
    _val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),
               "expected table index or identifier","");
    Lexer::err((Err *)auStack_48,&ctx->in,
               (string *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err> = puVar1;
    puVar2 = (undefined1 *)
             ((long)&idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 8);
    if (auStack_48 == (undefined1  [8])puVar2) {
      *puVar1 = CONCAT71(idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._9_7_,
                         idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._8_1_)
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x18) =
           idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err> = auStack_48;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                        super__Move_assign_alias<wasm::Name,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x10) =
           CONCAT71(idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._9_7_,
                    idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._8_1_);
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) =
         idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.
         super_IString.str._M_len;
    idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.
    super_IString.str._M_len = 0;
    idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\x01';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ != &local_58) {
      auStack_48 = (undefined1  [8])puVar2;
      operator_delete((void *)_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_
                      ,local_58._M_allocated_capacity + 1);
    }
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_90,
                    (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)auStack_48);
    if (_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_90,
                 _val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._M_first.
                 _M_storage.super_IString.str._M_len + (long)local_90);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err> = puVar1;
      if (local_b0 == &local_a0) {
        *puVar1 = local_a0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                 super__Move_assign_alias<wasm::Name,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x18) = uStack_98;
      }
      else {
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err> = local_b0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                 super__Move_assign_alias<wasm::Name,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x10) = local_a0;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) = local_a8;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_90);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_90);
      p_Var4 = (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)0x0;
      if (idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
        p_Var4 = (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)auStack_48;
      }
      pcVar3 = (p_Var4->super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>)._M_u.
               _M_first._M_storage.super_IString.str._M_str;
      *(size_t *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err> =
           (p_Var4->super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>)._M_u._M_first.
           _M_storage.super_IString.str._M_len;
      *(char **)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
                        super__Move_assign_alias<wasm::Name,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) = pcVar3;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)auStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TableIdxT> tableidx(Ctx& ctx) {
  if (auto idx = maybeTableidx(ctx)) {
    CHECK_ERR(idx);
    return *idx;
  }
  return ctx.in.err("expected table index or identifier");
}